

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

gravity_object_t * gravity_object_deserialize(gravity_vm *vm,json_value *entry)

{
  _json_value **pp_Var1;
  _json_value *p_Var2;
  int iVar3;
  gravity_object_t *pgVar4;
  gravity_function_t *pgVar5;
  gravity_class_t *pgVar6;
  
  if ((entry->type != json_object) || ((entry->u).boolean == 0)) {
    return (gravity_object_t *)0x0;
  }
  pp_Var1 = (entry->u).array.values;
  p_Var2 = pp_Var1[2];
  iVar3 = string_casencmp((char *)*pp_Var1,"type",4);
  if (iVar3 == 0) {
    if (p_Var2->type != json_string) {
      return (gravity_object_t *)0x0;
    }
    iVar3 = string_casencmp((p_Var2->u).string.ptr,"function",(ulong)(p_Var2->u).string.length);
    if (iVar3 == 0) {
      pgVar5 = gravity_function_deserialize(vm,entry);
      return (gravity_object_t *)pgVar5;
    }
    iVar3 = string_casencmp((p_Var2->u).string.ptr,"class",(ulong)(p_Var2->u).string.length);
    if (iVar3 == 0) {
      pgVar6 = gravity_class_deserialize(vm,entry);
      return pgVar6;
    }
    iVar3 = string_casencmp((p_Var2->u).string.ptr,"map",(ulong)(p_Var2->u).string.length);
    if ((iVar3 != 0) &&
       (iVar3 = string_casencmp((p_Var2->u).string.ptr,"enum",(ulong)(p_Var2->u).string.length),
       iVar3 != 0)) {
      iVar3 = string_casencmp((p_Var2->u).string.ptr,"range",(ulong)(p_Var2->u).string.length);
      if (iVar3 != 0) {
        return (gravity_object_t *)0x0;
      }
      pgVar4 = (gravity_object_t *)gravity_range_deserialize(vm,entry);
      return pgVar4;
    }
  }
  pgVar4 = (gravity_object_t *)gravity_map_deserialize(vm,entry);
  return pgVar4;
}

Assistant:

gravity_object_t *gravity_object_deserialize (gravity_vm *vm, json_value *entry) {
    // this function is able to deserialize ONLY objects with a type label
    
    // sanity check
    if (entry->type != json_object) return NULL;
    if (entry->u.object.length == 0) return NULL;

    // the first entry value must specify gravity object type
    const char *label = entry->u.object.values[0].name;
    json_value *value = entry->u.object.values[0].value;
    
    if (string_casencmp(label, GRAVITY_JSON_LABELTYPE, 4) != 0) {
        // if no label type found then assume it is a map object
        gravity_map_t *m = gravity_map_deserialize(vm, entry);
        return (gravity_object_t *)m;
    }
    
    // sanity check
    if (value->type != json_string) return NULL;

    // FUNCTION case
    if (string_casencmp(value->u.string.ptr, GRAVITY_JSON_FUNCTION, value->u.string.length) == 0) {
        gravity_function_t *f = gravity_function_deserialize(vm, entry);
        return (gravity_object_t *)f;
    }

    // CLASS case
    if (string_casencmp(value->u.string.ptr, GRAVITY_JSON_CLASS, value->u.string.length) == 0) {
        gravity_class_t *c = gravity_class_deserialize(vm, entry);
        return (gravity_object_t *)c;
    }

    // MAP/ENUM case
    if ((string_casencmp(value->u.string.ptr, GRAVITY_JSON_MAP, value->u.string.length) == 0) ||
        (string_casencmp(value->u.string.ptr, GRAVITY_JSON_ENUM, value->u.string.length) == 0)) {
        gravity_map_t *m = gravity_map_deserialize(vm, entry);
        return (gravity_object_t *)m;
    }
    
    // RANGE case
    if (string_casencmp(value->u.string.ptr, GRAVITY_JSON_RANGE, value->u.string.length) == 0) {
        gravity_range_t *range = gravity_range_deserialize(vm, entry);
        return (gravity_object_t *)range;
    }

    // unhandled case
    DEBUG_DESERIALIZE("gravity_object_deserialize unknown type");
    return NULL;
}